

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::~RefcountedTemplate(RefcountedTemplate *this)

{
  RefcountedTemplate *this_local;
  
  if (this->ptr_ != (Template *)0x0) {
    (*this->ptr_->_vptr_Template[1])();
  }
  Mutex::~Mutex(&this->mutex_);
  return;
}

Assistant:

~RefcountedTemplate() { delete ptr_; }